

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O3

int32_t icu_63::DayPeriodRulesDataSink::parseHour(UnicodeString *time,UErrorCode *errorCode)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  char16_t *pcVar4;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  sVar1 = (time->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar2 = (time->fUnion).fFields.fLength;
  }
  else {
    uVar2 = (int)sVar1 >> 5;
  }
  if (2 < uVar2 && (uVar2 & 0xfffffffe) == 4) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar4 = (time->fUnion).fFields.fArray;
    }
    else {
      pcVar4 = (time->fUnion).fStackFields.fBuffer;
    }
    if ((((pcVar4[uVar2 - 3] == L':') && (pcVar4[(ulong)uVar2 - 2] == L'0')) &&
        (pcVar4[(ulong)uVar2 - 1] == L'0')) && (0xfff5 < (ushort)(*pcVar4 + L'ￆ'))) {
      iVar3 = (ushort)*pcVar4 - 0x30;
      if (uVar2 - 3 != 2) {
        return iVar3;
      }
      if ((0xfff5 < (ushort)(pcVar4[1] + L'ￆ')) &&
         (iVar3 = (uint)(ushort)pcVar4[1] + iVar3 * 10 + -0x30, iVar3 < 0x19)) {
        return iVar3;
      }
    }
  }
  *errorCode = U_INVALID_FORMAT_ERROR;
  return 0;
}

Assistant:

static int32_t parseHour(const UnicodeString &time, UErrorCode &errorCode) {
        if (U_FAILURE(errorCode)) {
            return 0;
        }

        int32_t hourLimit = time.length() - 3;
        // `time` must look like "x:00" or "xx:00".
        // If length is wrong or `time` doesn't end with ":00", error out.
        if ((hourLimit != 1 && hourLimit != 2) ||
                time[hourLimit] != 0x3A || time[hourLimit + 1] != 0x30 ||
                time[hourLimit + 2] != 0x30) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return 0;
        }

        // If `time` doesn't begin with a number in [0, 24], error out.
        // Note: "24:00" is possible in "before 24:00".
        int32_t hour = time[0] - 0x30;
        if (hour < 0 || 9 < hour) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return 0;
        }
        if (hourLimit == 2) {
            int32_t hourDigit2 = time[1] - 0x30;
            if (hourDigit2 < 0 || 9 < hourDigit2) {
                errorCode = U_INVALID_FORMAT_ERROR;
                return 0;
            }
            hour = hour * 10 + hourDigit2;
            if (hour > 24) {
                errorCode = U_INVALID_FORMAT_ERROR;
                return 0;
            }
        }

        return hour;
    }